

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorydata.cpp
# Opt level: O2

int __thiscall ncnn::MemoryData::load_model(MemoryData *this,ModelBin *mb)

{
  int *piVar1;
  Allocator *pAVar2;
  int iVar3;
  void *local_58;
  int *local_50;
  size_t local_48;
  int local_40;
  Allocator *local_38;
  int local_30;
  int iStack_2c;
  int iStack_28;
  int iStack_24;
  int local_20;
  size_t local_18;
  
  if (this->d == 0) {
    if (this->c == 0) {
      if (this->h == 0) {
        if (this->w == 0) {
          Mat::create(&this->data,1,4,(Allocator *)0x0);
          goto LAB_00309299;
        }
        (*mb->_vptr_ModelBin[2])(&local_58,mb,(ulong)(uint)this->w,1);
        if (&this->data != (Mat *)&local_58) {
          if (local_50 != (int *)0x0) {
            LOCK();
            *local_50 = *local_50 + 1;
            UNLOCK();
          }
          piVar1 = (this->data).refcount;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              pAVar2 = (this->data).allocator;
              if (pAVar2 == (Allocator *)0x0) {
                free((this->data).data);
              }
              else {
                (*pAVar2->_vptr_Allocator[3])();
              }
            }
          }
          (this->data).data = local_58;
          (this->data).refcount = local_50;
          (this->data).elemsize = local_48;
          (this->data).elempack = local_40;
          (this->data).allocator = local_38;
          (this->data).dims = local_30;
          (this->data).w = iStack_2c;
          (this->data).h = iStack_28;
          (this->data).d = iStack_24;
          (this->data).c = local_20;
          (this->data).cstep = local_18;
        }
        if (local_50 == (int *)0x0) goto LAB_00309299;
        LOCK();
        *local_50 = *local_50 + -1;
        UNLOCK();
        if (*local_50 != 0) goto LAB_00309299;
        if (local_38 != (Allocator *)0x0) {
          (*local_38->_vptr_Allocator[3])();
          goto LAB_00309299;
        }
      }
      else {
        (*mb->_vptr_ModelBin[3])(&local_58,mb,(ulong)(uint)this->w,(ulong)(uint)this->h,1);
        if (&this->data != (Mat *)&local_58) {
          if (local_50 != (int *)0x0) {
            LOCK();
            *local_50 = *local_50 + 1;
            UNLOCK();
          }
          piVar1 = (this->data).refcount;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              pAVar2 = (this->data).allocator;
              if (pAVar2 == (Allocator *)0x0) {
                free((this->data).data);
              }
              else {
                (*pAVar2->_vptr_Allocator[3])();
              }
            }
          }
          (this->data).data = local_58;
          (this->data).refcount = local_50;
          (this->data).elemsize = local_48;
          (this->data).elempack = local_40;
          (this->data).allocator = local_38;
          (this->data).dims = local_30;
          (this->data).w = iStack_2c;
          (this->data).h = iStack_28;
          (this->data).d = iStack_24;
          (this->data).c = local_20;
          (this->data).cstep = local_18;
        }
        if (local_50 == (int *)0x0) goto LAB_00309299;
        LOCK();
        *local_50 = *local_50 + -1;
        UNLOCK();
        if (*local_50 != 0) goto LAB_00309299;
        if (local_38 != (Allocator *)0x0) {
          (*local_38->_vptr_Allocator[3])();
          goto LAB_00309299;
        }
      }
    }
    else {
      (*mb->_vptr_ModelBin[4])
                (&local_58,mb,(ulong)(uint)this->w,(ulong)(uint)this->h,(ulong)(uint)this->c,1);
      if (&this->data != (Mat *)&local_58) {
        if (local_50 != (int *)0x0) {
          LOCK();
          *local_50 = *local_50 + 1;
          UNLOCK();
        }
        piVar1 = (this->data).refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            pAVar2 = (this->data).allocator;
            if (pAVar2 == (Allocator *)0x0) {
              free((this->data).data);
            }
            else {
              (*pAVar2->_vptr_Allocator[3])();
            }
          }
        }
        (this->data).data = local_58;
        (this->data).refcount = local_50;
        (this->data).elemsize = local_48;
        (this->data).elempack = local_40;
        (this->data).allocator = local_38;
        (this->data).dims = local_30;
        (this->data).w = iStack_2c;
        (this->data).h = iStack_28;
        (this->data).d = iStack_24;
        (this->data).c = local_20;
        (this->data).cstep = local_18;
      }
      if (local_50 == (int *)0x0) goto LAB_00309299;
      LOCK();
      *local_50 = *local_50 + -1;
      UNLOCK();
      if (*local_50 != 0) goto LAB_00309299;
      if (local_38 != (Allocator *)0x0) {
        (*local_38->_vptr_Allocator[3])();
        goto LAB_00309299;
      }
    }
  }
  else {
    (*mb->_vptr_ModelBin[5])
              (&local_58,mb,(ulong)(uint)this->w,(ulong)(uint)this->h,(ulong)(uint)this->d,
               (ulong)(uint)this->c,1);
    if (&this->data != (Mat *)&local_58) {
      if (local_50 != (int *)0x0) {
        LOCK();
        *local_50 = *local_50 + 1;
        UNLOCK();
      }
      piVar1 = (this->data).refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          pAVar2 = (this->data).allocator;
          if (pAVar2 == (Allocator *)0x0) {
            free((this->data).data);
          }
          else {
            (*pAVar2->_vptr_Allocator[3])();
          }
        }
      }
      (this->data).data = local_58;
      (this->data).refcount = local_50;
      (this->data).elemsize = local_48;
      (this->data).elempack = local_40;
      (this->data).allocator = local_38;
      (this->data).dims = local_30;
      (this->data).w = iStack_2c;
      (this->data).h = iStack_28;
      (this->data).d = iStack_24;
      (this->data).c = local_20;
      (this->data).cstep = local_18;
    }
    if (local_50 == (int *)0x0) goto LAB_00309299;
    LOCK();
    *local_50 = *local_50 + -1;
    UNLOCK();
    if (*local_50 != 0) goto LAB_00309299;
    if (local_38 != (Allocator *)0x0) {
      (*local_38->_vptr_Allocator[3])();
      goto LAB_00309299;
    }
  }
  free(local_58);
LAB_00309299:
  if (((this->data).data == (void *)0x0) ||
     (iVar3 = 0, (long)(this->data).c * (this->data).cstep == 0)) {
    iVar3 = -100;
  }
  return iVar3;
}

Assistant:

int MemoryData::load_model(const ModelBin& mb)
{
    if (d != 0)
    {
        data = mb.load(w, h, d, c, 1);
    }
    else if (c != 0)
    {
        data = mb.load(w, h, c, 1);
    }
    else if (h != 0)
    {
        data = mb.load(w, h, 1);
    }
    else if (w != 0)
    {
        data = mb.load(w, 1);
    }
    else // 0 0 0
    {
        data.create(1);
    }
    if (data.empty())
        return -100;

    return 0;
}